

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alist.c
# Opt level: O1

int array_list_add(p_array_list alist,void *item)

{
  ulong uVar1;
  void **ppvVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = alist->size;
  bVar8 = uVar1 != 0;
  if (bVar8) {
    ppvVar2 = alist->array;
    if (*ppvVar2 == (void *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (uVar1 - 1 == uVar7) goto LAB_001037a4;
        uVar5 = uVar7 + 1;
        lVar3 = uVar7 + 1;
        uVar7 = uVar5;
      } while (ppvVar2[lVar3] != (void *)0x0);
      bVar8 = uVar5 < uVar1;
    }
    ppvVar2[uVar5] = item;
    alist->count = alist->count + 1;
    if (bVar8) goto LAB_001037c0;
  }
LAB_001037a4:
  sVar6 = expand_array_list(alist);
  uVar4 = (int)(sVar6 >> 1) + 1;
  uVar5 = (ulong)uVar4;
  alist->array[(int)uVar4] = item;
  alist->count = alist->count + 1;
LAB_001037c0:
  return (int)uVar5;
}

Assistant:

int array_list_add(p_array_list alist, void* item) {
    for (int i = 0; i < alist->size; i++) {
        if (alist->array[i] == 0) {
            alist->array[i] = item;
            alist->count++;
            return i;
        }
    }
    int index = (int) ((expand_array_list(alist) / 2) + 1);
    alist->array[index] = item;
    alist->count++;
    return index;
}